

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_encoder.c
# Opt level: O0

lzma_ret lzma_stream_header_encode(lzma_stream_flags *options,uint8_t *out)

{
  _Bool _Var1;
  uint32_t num;
  uint32_t crc;
  uint8_t *out_local;
  lzma_stream_flags *options_local;
  
  if (options->version == 0) {
    out[0] = 0xfd;
    out[1] = '7';
    out[2] = 'z';
    out[3] = 'X';
    out[4] = 'Z';
    out[5] = '\0';
    _Var1 = stream_flags_encode(options,out + 6);
    if (_Var1) {
      options_local._4_4_ = LZMA_PROG_ERROR;
    }
    else {
      num = lzma_crc32(out + 6,2,0);
      write32ne(out + 8,num);
      options_local._4_4_ = LZMA_OK;
    }
  }
  else {
    options_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return options_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_header_encode(const lzma_stream_flags *options, uint8_t *out)
{
	assert(sizeof(lzma_header_magic) + LZMA_STREAM_FLAGS_SIZE
			+ 4 == LZMA_STREAM_HEADER_SIZE);

	if (options->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Magic
	memcpy(out, lzma_header_magic, sizeof(lzma_header_magic));

	// Stream Flags
	if (stream_flags_encode(options, out + sizeof(lzma_header_magic)))
		return LZMA_PROG_ERROR;

	// CRC32 of the Stream Header
	const uint32_t crc = lzma_crc32(out + sizeof(lzma_header_magic),
			LZMA_STREAM_FLAGS_SIZE, 0);

	write32le(out + sizeof(lzma_header_magic) + LZMA_STREAM_FLAGS_SIZE,
			crc);

	return LZMA_OK;
}